

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeStamp::checkRigidBodies(MoleculeStamp *this)

{
  bool bVar1;
  difference_type dVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  size_t sVar3;
  ostream *poVar4;
  undefined8 uVar5;
  iterator j;
  vector<int,_std::allocator<int>_> rigidAtoms;
  RigidBodyStamp *rbStamp;
  size_t i;
  iterator ri;
  ostringstream oss;
  MoleculeStamp *in_stack_fffffffffffffcc8;
  MoleculeStamp *in_stack_fffffffffffffcd0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffcd8;
  __normal_iterator<OpenMD::RigidBodyStamp_**,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
  in_stack_fffffffffffffce0;
  OpenMDException *this_00;
  __normal_iterator<OpenMD::RigidBodyStamp_**,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
  in_stack_fffffffffffffce8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd08;
  string local_290 [32];
  int *local_270;
  long local_268;
  int *local_248;
  int *local_240;
  int *local_238;
  OpenMDException local_230;
  undefined1 local_201;
  RigidBodyStamp **local_1e0;
  string local_1d8 [32];
  RigidBodyStamp **local_1b8;
  undefined8 local_1a0;
  RigidBodyStamp **local_198;
  RigidBodyStamp **local_190;
  RigidBodyStamp **local_188;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_190 = (RigidBodyStamp **)
              std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::
              begin((vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *)
                    in_stack_fffffffffffffcc8);
  local_198 = (RigidBodyStamp **)
              std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::end
                        ((vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                          *)in_stack_fffffffffffffcc8);
  local_1a0 = 0;
  local_188 = (RigidBodyStamp **)
              std::
              find<__gnu_cxx::__normal_iterator<OpenMD::RigidBodyStamp**,std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>>,OpenMD::RigidBodyStamp*>
                        (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                         (RigidBodyStamp **)in_stack_fffffffffffffcd8._M_current);
  local_1b8 = (RigidBodyStamp **)
              std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::end
                        ((vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                          *)in_stack_fffffffffffffcc8);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<OpenMD::RigidBodyStamp_**,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
                      *)in_stack_fffffffffffffcd0,
                     (__normal_iterator<OpenMD::RigidBodyStamp_**,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
                      *)in_stack_fffffffffffffcc8);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)local_180,"Error in Molecule ");
    getName_abi_cxx11_(in_stack_fffffffffffffcc8);
    poVar4 = std::operator<<(poVar4,local_1d8);
    poVar4 = std::operator<<(poVar4,":rigidBody[");
    local_1e0 = (RigidBodyStamp **)
                std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::
                begin((vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *
                      )in_stack_fffffffffffffcc8);
    dVar2 = __gnu_cxx::operator-
                      ((__normal_iterator<OpenMD::RigidBodyStamp_**,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
                        *)in_stack_fffffffffffffcd0,
                       (__normal_iterator<OpenMD::RigidBodyStamp_**,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
                        *)in_stack_fffffffffffffcc8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar2);
    std::operator<<(poVar4,"] is missing\n");
    std::__cxx11::string::~string(local_1d8);
    local_201 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    OpenMDException::OpenMDException
              ((OpenMDException *)in_stack_fffffffffffffce0._M_current,
               (string *)in_stack_fffffffffffffcd8._M_current);
    local_201 = 0;
    __cxa_throw(uVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  local_230.msg_.field_2._8_8_ =
       (_Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> *)0x0;
  while( true ) {
    uVar5 = local_230.msg_.field_2._8_8_;
    __last._M_current = (int *)getNRigidBodies((MoleculeStamp *)0x2ca55a);
    if (__last._M_current <= (ulong)uVar5) {
      std::__cxx11::ostringstream::~ostringstream(local_180);
      return;
    }
    local_230.msg_.field_2._M_allocated_capacity =
         (size_type)
         getRigidBodyStamp(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20)
                          );
    RigidBodyStamp::getMembers((RigidBodyStamp *)in_stack_fffffffffffffcc8);
    this_00 = &local_230;
    local_240 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc8);
    local_248 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc8);
    sVar3 = getNAtoms((MoleculeStamp *)0x2ca5e6);
    local_268 = sVar3 - 1;
    std::bind<std::greater<int>,std::_Placeholder<1>const&,unsigned_long>
              ((greater<int> *)in_stack_fffffffffffffcd8._M_current,
               (_Placeholder<1> *)in_stack_fffffffffffffcd0,
               (unsigned_long *)in_stack_fffffffffffffcc8);
    in_stack_fffffffffffffcd8 =
         std::
         find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                   (in_stack_fffffffffffffd08,__last,
                    (_Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> *)uVar5);
    local_238 = in_stack_fffffffffffffcd8._M_current;
    local_270 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffcd0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffcc8);
    if (bVar1) break;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    local_230.msg_.field_2._8_8_ = local_230.msg_.field_2._8_8_ + 1;
  }
  poVar4 = std::operator<<((ostream *)local_180,"Error in Molecule ");
  getName_abi_cxx11_(in_stack_fffffffffffffcc8);
  std::operator<<(poVar4,local_290);
  std::__cxx11::string::~string(local_290);
  uVar5 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(this_00,(string *)in_stack_fffffffffffffcd8._M_current);
  __cxa_throw(uVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void MoleculeStamp::checkRigidBodies() {
    std::ostringstream oss;
    std::vector<RigidBodyStamp*>::iterator ri =
        std::find(rigidBodyStamps_.begin(), rigidBodyStamps_.end(),
                  static_cast<RigidBodyStamp*>(NULL));
    if (ri != rigidBodyStamps_.end()) {
      oss << "Error in Molecule " << getName() << ":rigidBody["
          << ri - rigidBodyStamps_.begin() << "] is missing\n";
      throw OpenMDException(oss.str());
    }

    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp     = getRigidBodyStamp(i);
      std::vector<int> rigidAtoms = rbStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(rigidAtoms.begin(), rigidAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      if (j != rigidAtoms.end()) {
        oss << "Error in Molecule " << getName();
        throw OpenMDException(oss.str());
      }
    }
  }